

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

bool __thiscall mpt::item_array<mpt::metatype>::compact(item_array<mpt::metatype> *this)

{
  content<mpt::item<mpt::metatype>_> *pcVar1;
  item<mpt::metatype> *this_00;
  item<mpt::metatype> *piVar2;
  item<mpt::metatype> *this_01;
  long len;
  
  pcVar1 = (this->super_unique_array<mpt::item<mpt::metatype>_>)._ref._ref;
  this_01 = (item<mpt::metatype> *)(pcVar1 + 1);
  if (pcVar1 == (content<mpt::item<mpt::metatype>_> *)0x0) {
    piVar2 = (item<mpt::metatype> *)0x0;
    this_01 = (item<mpt::metatype> *)0x0;
  }
  else {
    piVar2 = (item<mpt::metatype> *)
             ((this_01->super_identifier)._val +
             (((pcVar1->super_buffer)._used & 0xffffffffffffffe0) - 0xc));
  }
  len = 0;
  this_00 = (item<mpt::metatype> *)0x0;
  for (; this_01 != piVar2; this_01 = this_01 + 1) {
    if ((this_01->super_reference<mpt::metatype>)._ref == (metatype *)0x0) {
      if (this_00 == (item<mpt::metatype> *)0x0) {
        this_00 = this_01;
      }
    }
    else {
      len = len + 1;
      if (this_00 == (item<mpt::metatype> *)0x0) {
        this_00 = (item<mpt::metatype> *)0x0;
      }
      else {
        item<mpt::metatype>::operator=(this_00,this_01);
        item<mpt::metatype>::~item(this_01);
        this_00 = this_00 + 1;
      }
    }
  }
  if (this_00 != (item<mpt::metatype> *)0x0) {
    content<mpt::item<mpt::metatype>_>::set_length
              ((this->super_unique_array<mpt::item<mpt::metatype>_>)._ref._ref,len);
  }
  return this_00 != (item<mpt::metatype> *)0x0;
}

Assistant:

bool compact()
	{
		item<T> *space = 0;
		long len = 0;
		for (item<T> *pos = this->begin(), *to = this->end(); pos != to; ++pos) {
			T *c = pos->instance();
			if (!c) {
				if (!space) space = pos;
				continue;
			}
			++len;
			if (!space) continue;
#if __cplusplus >= 201103L
			*space = std::move(*pos);
#else
			space->operator = (static_cast<const identifier &>(*pos));
			space->set_instance(pos->detach());
#endif
			pos->~item<T>();
			++space;
		}
		if (!space) {
			return false;
		}
		this->_ref.instance()->set_length(len);
		return true;
	}